

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::Finalize(idx2_file *Idx2,params *P)

{
  bool bVar1;
  undefined1 auVar2 [16];
  error<idx2::idx2_err_code> eVar3;
  double local_178;
  idx2_file *local_170;
  undefined2 local_168;
  bool bStack_166;
  anon_class_1_0_00000001 local_159;
  idx2_file *local_158;
  undefined2 local_150;
  bool bStack_14e;
  anon_class_8_1_32d6a57b local_148;
  error<idx2::idx2_err_code> local_140;
  undefined1 local_130 [8];
  error<idx2::idx2_err_code> Result_3;
  undefined2 local_118;
  bool bStack_116;
  anon_class_8_1_32d6a57b local_110;
  error<idx2::idx2_err_code> local_108;
  undefined1 local_f8 [8];
  error<idx2::idx2_err_code> Result_2;
  undefined2 local_e0;
  bool bStack_de;
  anon_class_8_1_32d6a57b local_d8;
  error<idx2::idx2_err_code> local_d0;
  undefined1 local_c0 [8];
  error<idx2::idx2_err_code> Result_1;
  char TformOrder [8];
  undefined2 local_a0;
  bool bStack_9e;
  anon_class_1_0_00000001 local_91;
  idx2_file *local_90;
  undefined2 local_88;
  bool bStack_86;
  anon_class_8_1_897e6233 local_80;
  double local_78;
  idx2_file *local_70;
  undefined2 local_68;
  bool bStack_66;
  anon_class_8_1_32d6a57b local_60;
  error<idx2::idx2_err_code> local_58;
  undefined1 local_48 [8];
  error<idx2::idx2_err_code> Result;
  params *P_local;
  idx2_file *Idx2_local;
  undefined2 local_20;
  undefined1 uStack_1e;
  undefined5 uStack_1d;
  double *local_18;
  double *local_10;
  
  Result._8_8_ = P;
  P_local = (params *)Idx2;
  eVar3 = CheckBrickSize(Idx2,P);
  local_58.Msg = eVar3.Msg;
  local_48 = (undefined1  [8])local_58.Msg;
  local_58._8_2_ = eVar3._8_2_;
  Result.Msg._0_1_ = local_58.Code;
  Result.Msg._1_1_ = local_58.StackIdx;
  local_58.StrGened = eVar3.StrGened;
  Result.Msg._2_1_ = local_58.StrGened;
  local_58 = eVar3;
  bVar1 = error::operator_cast_to_bool((error *)local_48);
  if (bVar1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(Result._8_8_ + 0x110);
    auVar2 = vpand_avx(auVar2,_DAT_002a4440);
    local_78 = auVar2._0_8_;
    local_18 = (double *)((long)&P_local[6].Meta.Dims3.field_0.field_3.XY.field_0 + 4);
    local_10 = &local_78;
    local_178 = local_78;
    if (local_78 < *local_18) {
      local_178 = *local_18;
    }
    *(double *)(Result._8_8_ + 0x110) = local_178;
    GuessNumLevelsIfNeeded((idx2_file *)P_local);
    if ((char)P_local[6].Meta.DType < '\x11') {
      if ((P_local[6].BrickDims3.field_0.field_0.Z < P_local[6].BrickDims3.field_0.field_0.Y) ||
         (P_local[6].BrickDims3.field_0.field_0.Z % P_local[6].BrickDims3.field_0.field_0.Y != 0)) {
        eVar3 = Finalize::anon_class_1_0_00000001::operator()(&local_91);
        TformOrder = (char  [8])eVar3.Msg;
        Idx2_local = (idx2_file *)TformOrder;
        local_a0 = eVar3._8_2_;
        local_20 = local_a0;
        bStack_9e = eVar3.StrGened;
        uStack_1e = bStack_9e;
      }
      else {
        Result_1.Code = NoError;
        Result_1.StackIdx = '\0';
        Result_1.StrGened = false;
        Result_1._11_5_ = 0;
        ComputeTransformOrder((idx2_file *)P_local,(params *)Result._8_8_,(char *)&Result_1.Code);
        BuildSubbands((idx2_file *)P_local,(params *)Result._8_8_);
        ComputeNumBricksPerLevel((idx2_file *)P_local,(params *)Result._8_8_);
        eVar3 = ComputeGlobalBricksOrder
                          ((idx2_file *)P_local,(params *)Result._8_8_,(char *)&Result_1.Code);
        local_d0.Msg = eVar3.Msg;
        local_c0 = (undefined1  [8])local_d0.Msg;
        local_d0._8_2_ = eVar3._8_2_;
        Result_1.Msg._0_1_ = local_d0.Code;
        Result_1.Msg._1_1_ = local_d0.StackIdx;
        local_d0.StrGened = eVar3.StrGened;
        Result_1.Msg._2_1_ = local_d0.StrGened;
        local_d0 = eVar3;
        bVar1 = error::operator_cast_to_bool((error *)local_c0);
        if (bVar1) {
          eVar3 = ComputeLocalBricksChunksFilesOrders((idx2_file *)P_local,(params *)Result._8_8_);
          local_108.Msg = eVar3.Msg;
          local_f8 = (undefined1  [8])local_108.Msg;
          local_108._8_2_ = eVar3._8_2_;
          Result_2.Msg._0_1_ = local_108.Code;
          Result_2.Msg._1_1_ = local_108.StackIdx;
          local_108.StrGened = eVar3.StrGened;
          Result_2.Msg._2_1_ = local_108.StrGened;
          local_108 = eVar3;
          bVar1 = error::operator_cast_to_bool((error *)local_f8);
          if (bVar1) {
            eVar3 = ComputeFileDirDepths((idx2_file *)P_local,(params *)Result._8_8_);
            local_140.Msg = eVar3.Msg;
            local_130 = (undefined1  [8])local_140.Msg;
            local_140._8_2_ = eVar3._8_2_;
            Result_3.Msg._0_1_ = local_140.Code;
            Result_3.Msg._1_1_ = local_140.StackIdx;
            local_140.StrGened = eVar3.StrGened;
            Result_3.Msg._2_1_ = local_140.StrGened;
            local_140 = eVar3;
            bVar1 = error::operator_cast_to_bool((error *)local_130);
            if (bVar1) {
              ComputeWaveletTransformDetails((idx2_file *)P_local);
              eVar3 = Finalize::anon_class_1_0_00000001::operator()(&local_159);
              local_170 = (idx2_file *)eVar3.Msg;
              Idx2_local = local_170;
              local_168 = eVar3._8_2_;
              local_20 = local_168;
              bStack_166 = eVar3.StrGened;
              uStack_1e = bStack_166;
            }
            else {
              local_148.Result = (error<idx2::idx2_err_code> *)local_130;
              eVar3 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_148);
              local_158 = (idx2_file *)eVar3.Msg;
              Idx2_local = local_158;
              local_150 = eVar3._8_2_;
              local_20 = local_150;
              bStack_14e = eVar3.StrGened;
              uStack_1e = bStack_14e;
            }
          }
          else {
            local_110.Result = (error<idx2::idx2_err_code> *)local_f8;
            eVar3 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_110);
            Result_3._8_8_ = eVar3.Msg;
            Idx2_local = (idx2_file *)Result_3._8_8_;
            local_118 = eVar3._8_2_;
            local_20 = local_118;
            bStack_116 = eVar3.StrGened;
            uStack_1e = bStack_116;
          }
        }
        else {
          local_d8.Result = (error<idx2::idx2_err_code> *)local_c0;
          eVar3 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_d8);
          Result_2._8_8_ = eVar3.Msg;
          Idx2_local = (idx2_file *)Result_2._8_8_;
          local_e0 = eVar3._8_2_;
          local_20 = local_e0;
          bStack_de = eVar3.StrGened;
          uStack_1e = bStack_de;
        }
      }
    }
    else {
      local_80.Idx2 = (idx2_file **)&P_local;
      eVar3 = Finalize::anon_class_8_1_897e6233::operator()(&local_80);
      local_90 = (idx2_file *)eVar3.Msg;
      Idx2_local = local_90;
      local_88 = eVar3._8_2_;
      local_20 = local_88;
      bStack_86 = eVar3.StrGened;
      uStack_1e = bStack_86;
    }
  }
  else {
    local_60.Result = (error<idx2::idx2_err_code> *)local_48;
    eVar3 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_60);
    local_70 = (idx2_file *)eVar3.Msg;
    Idx2_local = local_70;
    local_68 = eVar3._8_2_;
    local_20 = local_68;
    bStack_66 = eVar3.StrGened;
    uStack_1e = bStack_66;
  }
  eVar3.Code = (undefined1)local_20;
  eVar3.StackIdx = local_20._1_1_;
  eVar3.Msg = Idx2_local->Name;
  eVar3.StrGened = (bool)uStack_1e;
  eVar3._11_5_ = uStack_1d;
  return eVar3;
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file* Idx2, params* P)
{
  idx2_PropagateIfError(CheckBrickSize(Idx2, *P));
  P->Tolerance = Max(fabs(P->Tolerance), Idx2->Tolerance);
  //printf("tolerance = %.16f\n", P->Tolerance);
  GuessNumLevelsIfNeeded(Idx2);
  if (!(Idx2->NLevels <= idx2_file::MaxLevels))
    return idx2_Error(idx2_err_code::TooManyLevels, "Max # of levels = %d\n", Idx2->MaxLevels);
  if ((Idx2->BitPlanesPerChunk > Idx2->BitPlanesPerFile) ||
      (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk) != 0)
    return idx2_Error(idx2_err_code::SizeMismatched, "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");


  char TformOrder[8] = {};
  ComputeTransformOrder(Idx2, *P, TformOrder);

  BuildSubbands(Idx2, *P);

  ComputeNumBricksPerLevel(Idx2, *P);

  idx2_PropagateIfError(ComputeGlobalBricksOrder(Idx2, *P, TformOrder));
  idx2_PropagateIfError(ComputeLocalBricksChunksFilesOrders(Idx2, *P));

  idx2_PropagateIfError(ComputeFileDirDepths(Idx2, *P));

  ComputeWaveletTransformDetails(Idx2);

  return idx2_Error(idx2_err_code::NoError);
}